

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  FILE *__stream;
  FILE *__stream_00;
  __ssize_t _Var1;
  char *__s;
  char *local_30;
  size_t line_size;
  
  __stream = fopen((char *)dst,"r");
  if (__stream == (FILE *)0x0) {
    __s = "file1";
  }
  else {
    __stream_00 = fopen((char *)src,"wa");
    if (__stream_00 != (FILE *)0x0) {
      line_size = 0;
      local_30 = (char *)0x0;
      while( true ) {
        _Var1 = getline(&local_30,&line_size,__stream);
        if (_Var1 < 1) break;
        fputs(local_30,__stream_00);
      }
      free(local_30);
      return extraout_EAX;
    }
    __s = "file2";
  }
  perror(__s);
  exit(1);
}

Assistant:

void copy(const char *source, const char *dest) {
    FILE* file1 = fopen(source, "r");
    if(file1 == NULL){
        perror("file1");
        exit(EXIT_FAILURE);
    }
    FILE* file2 = fopen(dest, "wa");
    if(file2 == NULL){
        perror("file2");
        exit(EXIT_FAILURE);
    }
    size_t line_size=0;
    char* line_buf=0;
    while (getline(&line_buf, &line_size, file1) > 0) {
        fprintf(file2,"%s",line_buf);
    }
    free(line_buf);
    line_buf=NULL;
}